

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void load_buffer_and_round_shift(int16_t *in,int stride,__m128i *out,int bit)

{
  __m128i alVar1;
  longlong lVar2;
  int bit_local;
  __m128i *out_local;
  int stride_local;
  int16_t *in_local;
  
  lVar2 = *(longlong *)(in + 4);
  (*out)[0] = *(longlong *)in;
  (*out)[1] = lVar2;
  lVar2 = *(longlong *)((long)(in + stride) + 8);
  out[1][0] = *(longlong *)(in + stride);
  out[1][1] = lVar2;
  lVar2 = *(longlong *)((long)(in + (stride << 1)) + 8);
  out[2][0] = *(longlong *)(in + (stride << 1));
  out[2][1] = lVar2;
  lVar2 = *(longlong *)((long)(in + stride * 3) + 8);
  out[3][0] = *(longlong *)(in + stride * 3);
  out[3][1] = lVar2;
  lVar2 = *(longlong *)((long)(in + (stride << 2)) + 8);
  out[4][0] = *(longlong *)(in + (stride << 2));
  out[4][1] = lVar2;
  lVar2 = *(longlong *)((long)(in + stride * 5) + 8);
  out[5][0] = *(longlong *)(in + stride * 5);
  out[5][1] = lVar2;
  lVar2 = *(longlong *)((long)(in + stride * 6) + 8);
  out[6][0] = *(longlong *)(in + stride * 6);
  out[6][1] = lVar2;
  lVar2 = *(longlong *)((long)(in + stride * 7) + 8);
  out[7][0] = *(longlong *)(in + stride * 7);
  out[7][1] = lVar2;
  alVar1 = (__m128i)vpsllw_avx((undefined1  [16])*out,ZEXT416((uint)bit));
  *out = alVar1;
  alVar1 = (__m128i)vpsllw_avx((undefined1  [16])out[1],ZEXT416((uint)bit));
  out[1] = alVar1;
  alVar1 = (__m128i)vpsllw_avx((undefined1  [16])out[2],ZEXT416((uint)bit));
  out[2] = alVar1;
  alVar1 = (__m128i)vpsllw_avx((undefined1  [16])out[3],ZEXT416((uint)bit));
  out[3] = alVar1;
  alVar1 = (__m128i)vpsllw_avx((undefined1  [16])out[4],ZEXT416((uint)bit));
  out[4] = alVar1;
  alVar1 = (__m128i)vpsllw_avx((undefined1  [16])out[5],ZEXT416((uint)bit));
  out[5] = alVar1;
  alVar1 = (__m128i)vpsllw_avx((undefined1  [16])out[6],ZEXT416((uint)bit));
  out[6] = alVar1;
  alVar1 = (__m128i)vpsllw_avx((undefined1  [16])out[7],ZEXT416((uint)bit));
  out[7] = alVar1;
  return;
}

Assistant:

static inline void load_buffer_and_round_shift(const int16_t *in, int stride,
                                               __m128i *out, int bit) {
  out[0] = _mm_load_si128((const __m128i *)(in + 0 * stride));
  out[1] = _mm_load_si128((const __m128i *)(in + 1 * stride));
  out[2] = _mm_load_si128((const __m128i *)(in + 2 * stride));
  out[3] = _mm_load_si128((const __m128i *)(in + 3 * stride));
  out[4] = _mm_load_si128((const __m128i *)(in + 4 * stride));
  out[5] = _mm_load_si128((const __m128i *)(in + 5 * stride));
  out[6] = _mm_load_si128((const __m128i *)(in + 6 * stride));
  out[7] = _mm_load_si128((const __m128i *)(in + 7 * stride));
  out[0] = _mm_slli_epi16(out[0], bit);
  out[1] = _mm_slli_epi16(out[1], bit);
  out[2] = _mm_slli_epi16(out[2], bit);
  out[3] = _mm_slli_epi16(out[3], bit);
  out[4] = _mm_slli_epi16(out[4], bit);
  out[5] = _mm_slli_epi16(out[5], bit);
  out[6] = _mm_slli_epi16(out[6], bit);
  out[7] = _mm_slli_epi16(out[7], bit);
}